

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O2

void XUtf8DrawRtlString(Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,
                       char *string,int num_bytes)

{
  XFontStruct **ppXVar1;
  Display *pDVar2;
  GC p_Var3;
  unsigned_short uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  uint ucs_00;
  long lVar11;
  char glyph [2];
  int local_1a0;
  XChar2b *local_198;
  uint ucs;
  Display *local_188;
  int local_17c;
  GC local_178;
  long local_170;
  Drawable local_168;
  uchar *local_160;
  long local_158;
  uint local_14c;
  int *local_148;
  int *local_140;
  XChar2b buf [128];
  XChar2b local_38 [4];
  
  iVar7 = font_set->nb_font;
  lVar11 = (long)iVar7;
  if (0 < lVar11) {
    local_148 = font_set->ranges;
    piVar9 = font_set->encodings;
    ppXVar1 = font_set->fonts;
    for (lVar10 = 0; lVar11 != lVar10; lVar10 = lVar10 + 1) {
      if (ppXVar1[lVar10] != (XFontStruct *)0x0) {
        local_1a0 = 0;
        local_198 = local_38;
        local_188 = display;
        local_178 = gc;
        local_168 = d;
        local_158 = lVar10;
        local_140 = piVar9;
        do {
          p_Var3 = local_178;
          pDVar2 = local_188;
          iVar5 = (int)lVar10;
          lVar8 = (long)iVar5;
          local_170 = lVar8;
          if (num_bytes < 1) {
            if (local_1a0 < 1) {
              return;
            }
            XSetFont(local_188,local_178,ppXVar1[lVar8]->fid);
            iVar7 = XTextWidth16(ppXVar1[lVar8],local_198,local_1a0);
            XDrawString16(pDVar2,local_168,p_Var3,x - iVar7,y,local_198,local_1a0);
            return;
          }
          lVar10 = local_158;
          local_17c = iVar5;
          if (0x78 < local_1a0) {
            XSetFont(local_188,local_178,ppXVar1[lVar8]->fid);
            iVar5 = XTextWidth16(ppXVar1[lVar8],local_198,local_1a0);
            lVar10 = local_158;
            x = x - iVar5;
            XDrawString16(local_188,local_168,p_Var3,x,y,local_198,local_1a0);
            local_1a0 = 0;
            local_198 = local_38;
            piVar9 = local_140;
          }
          local_160 = (uchar *)string;
          local_14c = XFastConvertUtf8ToUcs((uchar *)string,num_bytes,&ucs);
          if ((int)local_14c < 2) {
            local_14c = 1;
          }
          uVar4 = XUtf8IsNonSpacing(ucs);
          ucs_00 = ucs;
          if (uVar4 != 0) {
            ucs = (uint)uVar4;
            ucs_00 = (uint)uVar4;
          }
          for (; lVar11 != lVar10; lVar10 = lVar10 + 1) {
            if (ppXVar1[lVar10] != (XFontStruct *)0x0) {
              iVar5 = piVar9[lVar10];
              iVar6 = ucs2fontmap(glyph,ucs_00,iVar5);
              if ((-1 < iVar6) &&
                 ((iVar5 != 0 ||
                  ((local_148[lVar10 * 2] <= (int)ucs_00 &&
                   ((int)ucs_00 <= local_148[lVar10 * 2 + 1])))))) {
                if (iVar7 != (int)lVar10) goto LAB_001f45b0;
                break;
              }
            }
          }
          lVar10 = local_158;
          ucs2fontmap(glyph,0x3f,piVar9[local_158]);
LAB_001f45b0:
          if ((uVar4 == 0) && (local_17c == (int)lVar10)) {
            local_198[-1].byte1 = glyph[0];
            local_198[-1].byte2 = glyph[1];
            local_198 = local_198 + -1;
            local_1a0 = local_1a0 + 1;
          }
          else {
            XSetFont(local_188,local_178,ppXVar1[local_170]->fid);
            iVar5 = XTextWidth16(ppXVar1[local_170],local_198,local_1a0);
            x = x - iVar5;
            XDrawString16(local_188,local_168,local_178,x,y,local_198,local_1a0);
            buf[0x7f].byte1 = glyph[0];
            buf[0x7f].byte2 = glyph[1];
            if (uVar4 == 0) {
              local_1a0 = 1;
              local_198 = buf + 0x7f;
            }
            else {
              local_198 = buf + 0x7f;
              iVar5 = XTextWidth16(ppXVar1[(int)lVar10],local_198,1);
              x = x + iVar5;
              local_1a0 = 1;
            }
          }
          string = (char *)(local_160 + local_14c);
          num_bytes = num_bytes - local_14c;
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void
XUtf8DrawRtlString(Display 		*display,
		   Drawable 		d,
		   XUtf8FontStruct 	*font_set,
		   GC 			gc,
		   int 			x,
		   int 			y,
		   const char		*string,
		   int 			num_bytes) {

  int 		*encodings;	/* encodings array */
  XFontStruct 	**fonts;	/* fonts array */
  Fl_XChar2b 	buf[128];	/* drawing buffer */
  Fl_XChar2b	*ptr;		/* pointer to the drawing buffer */
  int 		fnum;		/* index of the current font in the fonts array*/
  int 		i;		/* current byte in the XChar2b buffer */
  int 		first;		/* first valid font index */
  int 		last_fnum;	/* font index of the previous char */
  int 		nb_font;	/* quantity of fonts in the font array */
  char 		glyph[2];	/* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;	/* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;
  ptr = buf + 128;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      x -= XTextWidth16(fonts[fnum], ptr, i);
      XDrawString16(display, d, gc, x, y, ptr, i);
      i = 0;
      ptr = buf + 128;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] && (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      x -= XTextWidth16(fonts[last_fnum], ptr, i);
      XDrawString16(display, d, gc, x, y, ptr, i);
      i = 0;
      ptr = buf + 127;
      (*ptr).byte1 = glyph[0];
      (*ptr).byte2 = glyph[1];
      if (no_spc) {
	x += XTextWidth16(fonts[fnum], ptr, 1);
      }
    } else {
      ptr--;
      (*ptr).byte1 = glyph[0];
      (*ptr).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  if (i < 1) return;

  XSetFont(display, gc, fonts[fnum]->fid);
  x -= XTextWidth16(fonts[last_fnum], ptr, i);
  XDrawString16(display, d, gc, x, y, ptr, i);
}